

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O2

int ON__ClassIdDumpNode_CompareName(ON__ClassIdDumpNode **a,ON__ClassIdDumpNode **b)

{
  int iVar1;
  
  if (a == (ON__ClassIdDumpNode **)0x0) {
    return -(uint)(b != (ON__ClassIdDumpNode **)0x0);
  }
  if (b != (ON__ClassIdDumpNode **)0x0) {
    iVar1 = ON__ClassIdDumpNode::CompareClassName(*a,*b);
    return iVar1;
  }
  return 1;
}

Assistant:

static int ON__ClassIdDumpNode_CompareName( ON__ClassIdDumpNode *const* a, ON__ClassIdDumpNode *const* b )
{
  int rc = 0;
  if ( 0 == a )
  {
    rc = (0 == b) ? 0 : -1;
  }
  else if ( 0 == b )
  {
    rc = 1;
  }
  else
  {
    rc = (*a)->CompareClassName(*(*b));
  }
  return rc;
}